

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void __thiscall
fmt::internal::PrintfFormatter<char>::format
          (PrintfFormatter<char> *this,BasicWriter<char> *writer,BasicCStringRef<char> format_str)

{
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  Buffer<char> *pBVar4;
  byte *pbVar5;
  bool bVar6;
  uint uVar7;
  FormatError *this_00;
  ptrdiff_t _Num;
  size_t sVar8;
  Arg *arg_00;
  Arg *arg_01;
  size_t sVar9;
  char *str;
  byte *pbVar10;
  ptrdiff_t _Num_1;
  BasicCStringRef<char> BVar11;
  Arg arg;
  byte *local_90;
  FormatSpec local_88;
  Arg *local_70;
  BasicWriter<char> *local_68;
  FormatSpec *local_60;
  Arg local_58;
  
  if (*format_str.data_ != '\0') {
    BVar11.data_ = format_str.data_;
    local_70 = (Arg *)this;
    do {
      local_90 = (byte *)BVar11.data_ + 1;
      if (*BVar11.data_ == 0x25) {
        if (*local_90 == 0x25) {
          if ((byte *)format_str.data_ != local_90) {
            sVar8 = (long)local_90 - (long)format_str.data_;
            pBVar4 = writer->buffer_;
            sVar9 = pBVar4->size_;
            uVar2 = sVar9 + sVar8;
            if (pBVar4->capacity_ < uVar2) {
              (**pBVar4->_vptr_Buffer)(pBVar4,uVar2);
              sVar9 = pBVar4->size_;
            }
            memmove(pBVar4->ptr_ + sVar9,format_str.data_,sVar8);
            pBVar4->size_ = uVar2;
          }
          format_str.data_ = (char *)(local_90 + 1);
          local_90 = (byte *)format_str.data_;
        }
        else {
          if (format_str.data_ != BVar11.data_) {
            pBVar4 = writer->buffer_;
            sVar9 = pBVar4->size_;
            uVar2 = sVar9 + ((long)BVar11.data_ - (long)format_str.data_);
            if (pBVar4->capacity_ < uVar2) {
              (**pBVar4->_vptr_Buffer)(pBVar4,uVar2);
              sVar9 = pBVar4->size_;
            }
            memmove(pBVar4->ptr_ + sVar9,format_str.data_,
                    (long)BVar11.data_ - (long)format_str.data_);
            pBVar4->size_ = uVar2;
          }
          arg_01 = local_70;
          local_88.super_AlignSpec.super_WidthSpec.width_ = 0;
          local_88.super_AlignSpec.super_WidthSpec.fill_ = L' ';
          local_88.super_AlignSpec.align_ = ALIGN_RIGHT;
          local_88.flags_ = 0;
          local_88.precision_ = 0xffffffff;
          local_88.type_ = '\0';
          uVar7 = parse_header((PrintfFormatter<char> *)local_70,(char **)&local_90,&local_88);
          pbVar1 = local_90;
          if (*local_90 == 0x2e) {
            if ((byte)(local_90[1] - 0x30) < 10) {
              local_90 = local_90 + 1;
              local_88.precision_ = parse_nonnegative_int<char>((char **)&local_90);
              pbVar1 = local_90;
            }
            else {
              pbVar1 = local_90 + 1;
              if (local_90[1] == 0x2a) {
                local_90 = local_90 + 2;
                arg_00 = arg_01;
                get_arg(&local_58,(PrintfFormatter<char> *)arg_01,(char *)local_90,0xffffffff);
                local_88.precision_ =
                     ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int>::visit
                               ((ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int> *)
                                &local_58,arg_00);
                pbVar1 = local_90;
              }
            }
          }
          local_90 = pbVar1;
          get_arg(&local_58,(PrintfFormatter<char> *)arg_01,(char *)local_90,uVar7);
          uVar7 = local_88.flags_;
          if (((local_88._8_8_ & 0x800000000) != 0) &&
             (bVar6 = ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool>::visit
                                ((ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool> *)
                                 &local_58,arg_01), bVar6)) {
            local_88._8_8_ = CONCAT44(uVar7,local_88.super_AlignSpec.align_) & 0xfffffff7ffffffff;
          }
          pbVar1 = local_90;
          if (local_88.super_AlignSpec.super_WidthSpec.fill_ == L'0') {
            if ((int)local_58.type < 10) {
              local_88.super_AlignSpec.align_ = 4;
            }
            else {
              local_88.super_AlignSpec.super_WidthSpec.fill_ = L' ';
            }
          }
          pbVar10 = local_90 + 1;
          bVar3 = *local_90;
          if (bVar3 < 0x6c) {
            pbVar5 = pbVar10;
            if (bVar3 != 0x4c) {
              if (bVar3 == 0x68) {
                if ((int)(char)*pbVar10 == 0x68) {
                  pbVar10 = local_90 + 2;
                  pbVar1 = local_90 + 2;
                  local_90 = pbVar10;
                  ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>::visit
                            ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>
                              *)&local_58,(Arg *)(ulong)(uint)(int)(char)*pbVar1);
                  pbVar5 = local_90;
                }
                else {
                  local_90 = pbVar10;
                  ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void>::visit
                            ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void> *)
                             &local_58,(Arg *)(ulong)(uint)(int)(char)*pbVar10);
                  pbVar5 = local_90;
                }
              }
              else {
                if (bVar3 == 0x6a) goto LAB_00147abd;
LAB_00147b2f:
                ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void>::visit
                          ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void> *)
                           &local_58,(Arg *)(ulong)(uint)(int)(char)*local_90);
                pbVar10 = pbVar1;
                pbVar5 = local_90;
              }
            }
          }
          else if (bVar3 == 0x6c) {
            uVar7 = (uint)(char)*pbVar10;
            if (uVar7 != 0x6c) goto LAB_00147ac1;
            pbVar10 = local_90 + 2;
            pbVar1 = local_90 + 2;
            local_90 = pbVar10;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void> *)
                       &local_58,(Arg *)(ulong)(uint)(int)(char)*pbVar1);
            pbVar5 = local_90;
          }
          else if (bVar3 == 0x74) {
LAB_00147abd:
            uVar7 = (uint)(char)*pbVar10;
LAB_00147ac1:
            local_90 = pbVar10;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)&local_58
                       ,(Arg *)(ulong)uVar7);
            pbVar5 = local_90;
          }
          else {
            if (bVar3 != 0x7a) goto LAB_00147b2f;
            local_90 = pbVar10;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void> *)
                       &local_58,(Arg *)(ulong)(uint)(int)(char)*pbVar10);
            pbVar5 = local_90;
          }
          local_90 = pbVar5;
          if (*pbVar10 == 0) {
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x155178);
            __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
          }
          format_str.data_ = (char *)(pbVar10 + 1);
          local_88.type_ = *pbVar10;
          local_90 = (byte *)format_str.data_;
          if ((int)local_58.type < 8) {
            if (local_88.type_ == 99) {
              ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void>::visit
                        ((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)&local_58,
                         &local_58);
            }
            else if ((local_88.type_ == 0x75) || (local_88.type_ == 0x69)) {
              local_88.type_ = 100;
            }
          }
          local_60 = &local_88;
          local_68 = writer;
          ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void>::visit
                    ((ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *)&local_68,
                     &local_58);
        }
      }
      BVar11.data_ = (char *)local_90;
    } while (*local_90 != 0);
    if ((byte *)format_str.data_ != local_90) {
      sVar8 = (long)local_90 - (long)format_str.data_;
      pBVar4 = writer->buffer_;
      sVar9 = pBVar4->size_;
      uVar2 = sVar9 + sVar8;
      if (pBVar4->capacity_ < uVar2) {
        (**pBVar4->_vptr_Buffer)(pBVar4,uVar2);
        sVar9 = pBVar4->size_;
      }
      memmove(pBVar4->ptr_ + sVar9,format_str.data_,sVar8);
      pBVar4->size_ = uVar2;
    }
  }
  return;
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::format(
    BasicWriter<Char> &writer, BasicCStringRef<Char> format_str) {
  const Char *start = format_str.c_str();
  const Char *s = start;
  while (*s) {
    Char c = *s++;
    if (c != '%') continue;
    if (*s == c) {
      write(writer, start, s);
      start = ++s;
      continue;
    }
    write(writer, start, s - 1);

    FormatSpec spec;
    spec.align_ = ALIGN_RIGHT;

    // Parse argument index, flags and width.
    unsigned arg_index = parse_header(s, spec);

    // Parse precision.
    if (*s == '.') {
      ++s;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = static_cast<int>(parse_nonnegative_int(s));
      } else if (*s == '*') {
        ++s;
        spec.precision_ = fmt::PrecisionHandler().visit(get_arg(s));
      }
    }

    Arg arg = get_arg(s, arg_index);
    if (spec.flag(HASH_FLAG) && fmt::IsZeroInt().visit(arg))
      spec.flags_ &= ~to_unsigned<int>(HASH_FLAG);
    if (spec.fill_ == '0') {
      if (arg.type <= Arg::LAST_NUMERIC_TYPE)
        spec.align_ = ALIGN_NUMERIC;
      else
        spec.fill_ = ' ';  // Ignore '0' flag for non-numeric types.
    }

    // Parse length and convert the argument to the required type.
    switch (*s++) {
    case 'h':
      if (*s == 'h')
        fmt::ArgConverter<signed char>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<short>(arg, *s).visit(arg);
      break;
    case 'l':
      if (*s == 'l')
        fmt::ArgConverter<fmt::LongLong>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<long>(arg, *s).visit(arg);
      break;
    case 'j':
      fmt::ArgConverter<intmax_t>(arg, *s).visit(arg);
      break;
    case 'z':
      fmt::ArgConverter<std::size_t>(arg, *s).visit(arg);
      break;
    case 't':
      fmt::ArgConverter<std::ptrdiff_t>(arg, *s).visit(arg);
      break;
    case 'L':
      // printf produces garbage when 'L' is omitted for long double, no
      // need to do the same.
      break;
    default:
      --s;
      fmt::ArgConverter<void>(arg, *s).visit(arg);
    }

    // Parse type.
    if (!*s)
      FMT_THROW(FormatError("invalid format string"));
    spec.type_ = static_cast<char>(*s++);
    if (arg.type <= Arg::LAST_INTEGER_TYPE) {
      // Normalize type.
      switch (spec.type_) {
      case 'i': case 'u':
        spec.type_ = 'd';
        break;
      case 'c':
        // TODO: handle wchar_t
        fmt::CharConverter(arg).visit(arg);
        break;
      }
    }

    start = s;

    // Format argument.
    internal::PrintfArgFormatter<Char>(writer, spec).visit(arg);
  }
  write(writer, start, s);
}